

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitSelect(WasmBytecodeGenerator *this)

{
  WasmType wasmType;
  OpCodeAsmJs OVar1;
  RegSlot RVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  WasmRegisterSpace *this_00;
  ulong uVar6;
  EmitInfo local_50;
  EmitInfo conditionInfo;
  EmitInfo trueInfo;
  EmitInfo falseInfo;
  
  local_50 = PopEvalStack(this,FirstLocalType,L"select condition must have i32 type");
  trueInfo = PopEvalStack(this,Any,(char16 *)0x0);
  conditionInfo = PopEvalStack(this,trueInfo.type,L"select operands must both have same type");
  ReleaseLocation(this,&local_50);
  ReleaseLocation(this,&trueInfo);
  ReleaseLocation(this,&conditionInfo);
  wasmType = conditionInfo.type;
  uVar6 = (ulong)conditionInfo.type;
  if (this->isUnreachable == true) {
    if (conditionInfo.type == Any) {
      uVar6 = (ulong)trueInfo >> 0x20;
    }
    uVar5 = 0xffffffff;
  }
  else {
    this_00 = GetRegisterSpace(this,conditionInfo.type);
    RVar2 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
    uVar3 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
    uVar4 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
    OVar1 = GetLoadOp(this,wasmType);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1a])
              (this->m_writer,0x27,(ulong)uVar3,(ulong)local_50 & 0xffffffff);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)OVar1,(ulong)RVar2,(ulong)conditionInfo & 0xffffffff);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])(this->m_writer,(ulong)uVar4,0x25);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar3);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)OVar1,(ulong)RVar2,(ulong)trueInfo & 0xffffffff);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar4);
    uVar5 = (ulong)RVar2;
  }
  return (EmitInfo)(uVar6 << 0x20 | uVar5);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSelect()
{
    EmitInfo conditionInfo = PopEvalStack(WasmTypes::I32, _u("select condition must have i32 type"));
    EmitInfo falseInfo = PopValuePolymorphic();
    EmitInfo trueInfo = PopEvalStack(falseInfo.type, _u("select operands must both have same type"));
    ReleaseLocation(&conditionInfo);
    ReleaseLocation(&falseInfo);
    ReleaseLocation(&trueInfo);

    if (IsUnreachable())
    {
        if (trueInfo.type == WasmTypes::Any)
        {
            // Report the type of falseInfo for type checking
            return EmitInfo(falseInfo.type);
        }
        // Otherwise report the type of trueInfo for type checking
        return EmitInfo(trueInfo.type);
    }
    WasmTypes::WasmType selectType = trueInfo.type;
    EmitInfo resultInfo = EmitInfo(GetRegisterSpace(selectType)->AcquireTmpRegister(), selectType);

    Js::ByteCodeLabel falseLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel doneLabel = m_writer->DefineLabel();
    Js::OpCodeAsmJs loadOp = GetLoadOp(resultInfo.type);


    // var result;
    // if (!condition) goto:condFalse
    // result = trueRes;
    // goto:done;
    //:condFalse
    // result = falseRes;
    //:done
    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrFalse_Int, falseLabel, conditionInfo.location);
    m_writer->AsmReg2(loadOp, resultInfo.location, trueInfo.location);
    m_writer->AsmBr(doneLabel);
    m_writer->MarkAsmJsLabel(falseLabel);
    m_writer->AsmReg2(loadOp, resultInfo.location, falseInfo.location);
    m_writer->MarkAsmJsLabel(doneLabel);

    return resultInfo;
}